

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledMisc.cpp
# Opt level: O3

void Imf_3_4::precalculateTileInfo
               (TileDescription *tileDesc,int minX,int maxX,int minY,int maxY,int **numXTiles,
               int **numYTiles,int *numXLevels,int *numYLevels)

{
  LevelMode LVar1;
  int iVar2;
  int *piVar3;
  ArgExc *this;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  LevelRoundingMode local_5c;
  
  LVar1 = tileDesc->mode;
  if (LVar1 == RIPMAP_LEVELS) {
    iVar2 = maxX - minX;
    if (tileDesc->roundingMode == ROUND_DOWN) {
      if (iVar2 < 1) goto LAB_001a6b47;
      iVar5 = 0;
      uVar6 = (ulong)(iVar2 + 1);
      do {
        iVar5 = iVar5 + 1;
        uVar7 = (uint)uVar6;
        uVar6 = uVar6 >> 1;
      } while (3 < uVar7);
LAB_001a6acc:
      *numXLevels = iVar5 + 1;
      local_5c = tileDesc->roundingMode;
      if (LVar1 == ONE_LEVEL) goto LAB_001a6ba3;
      if (LVar1 != RIPMAP_LEVELS) {
        if (LVar1 != MIPMAP_LEVELS) {
          this = (ArgExc *)__cxa_allocate_exception(0x48);
          Iex_3_4::ArgExc::ArgExc(this,"Unknown LevelMode format.");
LAB_001a6d63:
          __cxa_throw(this,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
        }
        goto LAB_001a6aed;
      }
    }
    else {
      if (0 < iVar2) {
        iVar5 = 0;
        iVar9 = 0;
        uVar6 = (ulong)(iVar2 + 1);
        do {
          if ((uVar6 & 1) != 0) {
            iVar5 = 1;
          }
          iVar9 = iVar9 + 1;
          uVar7 = (uint)uVar6;
          uVar6 = uVar6 >> 1;
        } while (3 < uVar7);
LAB_001a6a85:
        iVar5 = iVar5 + iVar9;
        goto LAB_001a6acc;
      }
LAB_001a6b47:
      *numXLevels = 1;
      local_5c = tileDesc->roundingMode;
    }
    iVar2 = maxY - minY;
    if (local_5c == ROUND_DOWN) {
      if (iVar2 < 1) goto LAB_001a6bf2;
      iVar5 = 0;
      uVar6 = (ulong)(iVar2 + 1);
      do {
        iVar5 = iVar5 + 1;
        uVar7 = (uint)uVar6;
        uVar6 = uVar6 >> 1;
      } while (3 < uVar7);
    }
    else if (iVar2 < 1) {
LAB_001a6bf2:
      iVar5 = 0;
    }
    else {
      iVar5 = 0;
      iVar9 = 0;
      uVar6 = (ulong)(iVar2 + 1);
      do {
        if ((uVar6 & 1) != 0) {
          iVar5 = 1;
        }
        iVar9 = iVar9 + 1;
        uVar7 = (uint)uVar6;
        uVar6 = uVar6 >> 1;
      } while (3 < uVar7);
      iVar5 = iVar5 + iVar9;
    }
  }
  else {
    if (LVar1 != MIPMAP_LEVELS) {
      if (LVar1 != ONE_LEVEL) {
        this = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_3_4::ArgExc::ArgExc(this,"Unknown LevelMode format.");
        goto LAB_001a6d63;
      }
      *numXLevels = 1;
      local_5c = tileDesc->roundingMode;
LAB_001a6ba3:
      uVar7 = 1;
      goto LAB_001a6bfc;
    }
    uVar4 = (maxX - minX) + 1;
    uVar7 = (maxY - minY) + 1;
    if ((int)uVar7 < (int)uVar4) {
      uVar7 = uVar4;
    }
    if (tileDesc->roundingMode == ROUND_DOWN) {
      if (1 < (int)uVar7) {
        iVar5 = 0;
        uVar6 = (ulong)uVar7;
        do {
          iVar5 = iVar5 + 1;
          uVar7 = (uint)uVar6;
          uVar6 = uVar6 >> 1;
        } while (3 < uVar7);
        goto LAB_001a6acc;
      }
    }
    else if (1 < (int)uVar7) {
      iVar5 = 0;
      iVar9 = 0;
      uVar6 = (ulong)uVar7;
      do {
        if ((uVar6 & 1) != 0) {
          iVar5 = 1;
        }
        iVar9 = iVar9 + 1;
        uVar7 = (uint)uVar6;
        uVar6 = uVar6 >> 1;
      } while (3 < uVar7);
      goto LAB_001a6a85;
    }
    *numXLevels = 1;
    local_5c = tileDesc->roundingMode;
LAB_001a6aed:
    uVar4 = (maxX - minX) + 1;
    uVar7 = (maxY - minY) + 1;
    if ((int)uVar7 < (int)uVar4) {
      uVar7 = uVar4;
    }
    if (local_5c == ROUND_DOWN) {
      if ((int)uVar7 < 2) goto LAB_001a6bc7;
      iVar5 = 0;
      uVar6 = (ulong)uVar7;
      do {
        iVar5 = iVar5 + 1;
        uVar7 = (uint)uVar6;
        uVar6 = uVar6 >> 1;
      } while (3 < uVar7);
    }
    else if ((int)uVar7 < 2) {
LAB_001a6bc7:
      iVar5 = 0;
    }
    else {
      iVar5 = 0;
      iVar2 = 0;
      uVar6 = (ulong)uVar7;
      do {
        if ((uVar6 & 1) != 0) {
          iVar5 = 1;
        }
        iVar2 = iVar2 + 1;
        uVar7 = (uint)uVar6;
        uVar6 = uVar6 >> 1;
      } while (3 < uVar7);
      iVar5 = iVar5 + iVar2;
    }
  }
  uVar7 = iVar5 + 1;
LAB_001a6bfc:
  *numYLevels = uVar7;
  lVar10 = (long)*numXLevels;
  uVar6 = lVar10 * 4;
  if (lVar10 < 0) {
    uVar6 = 0xffffffffffffffff;
  }
  piVar3 = (int *)operator_new__(uVar6);
  *numXTiles = piVar3;
  uVar6 = (ulong)uVar7 << 2;
  if ((int)uVar7 < 0) {
    uVar6 = 0xffffffffffffffff;
  }
  piVar3 = (int *)operator_new__(uVar6);
  *numYTiles = piVar3;
  if (0 < lVar10) {
    piVar3 = *numXTiles;
    uVar7 = tileDesc->xSize;
    lVar8 = 0;
    do {
      iVar2 = levelSize(minX,maxX,(int)lVar8,local_5c);
      piVar3[lVar8] = (int)(((long)iVar2 + ((long)(int)uVar7 - 1U)) / (ulong)(long)(int)uVar7);
      lVar8 = lVar8 + 1;
    } while (lVar10 != lVar8);
    piVar3 = *numYTiles;
    uVar7 = *numYLevels;
    local_5c = tileDesc->roundingMode;
  }
  if (0 < (int)uVar7) {
    uVar4 = tileDesc->ySize;
    uVar6 = 0;
    do {
      iVar2 = levelSize(minY,maxY,(int)uVar6,local_5c);
      piVar3[uVar6] = (int)(((long)iVar2 + ((long)(int)uVar4 - 1U)) / (ulong)(long)(int)uVar4);
      uVar6 = uVar6 + 1;
    } while (uVar7 != uVar6);
  }
  return;
}

Assistant:

void
precalculateTileInfo (
    const TileDescription& tileDesc,
    int                    minX,
    int                    maxX,
    int                    minY,
    int                    maxY,
    int*&                  numXTiles,
    int*&                  numYTiles,
    int&                   numXLevels,
    int&                   numYLevels)
{
    numXLevels = calculateNumXLevels (tileDesc, minX, maxX, minY, maxY);
    numYLevels = calculateNumYLevels (tileDesc, minX, maxX, minY, maxY);

    numXTiles = new int[numXLevels];
    numYTiles = new int[numYLevels];

    calculateNumTiles (
        numXTiles,
        numXLevels,
        minX,
        maxX,
        tileDesc.xSize,
        tileDesc.roundingMode);

    calculateNumTiles (
        numYTiles,
        numYLevels,
        minY,
        maxY,
        tileDesc.ySize,
        tileDesc.roundingMode);
}